

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O2

size_t wwLoZeroBits(word *a,size_t n)

{
  size_t sVar1;
  long lVar2;
  
  lVar2 = 0;
  sVar1 = 0;
  do {
    if (n == sVar1) {
LAB_0013002b:
      return n << 6;
    }
    if (a[sVar1] != 0) {
      if (n != sVar1) {
        sVar1 = u64CTZ(a[sVar1]);
        return sVar1 - lVar2;
      }
      goto LAB_0013002b;
    }
    sVar1 = sVar1 + 1;
    lVar2 = lVar2 + -0x40;
  } while( true );
}

Assistant:

size_t wwLoZeroBits(const word a[], size_t n)
{
	register size_t i;
	ASSERT(wwIsValid(a, n));
	// поиск младшего ненулевого машинного слова
	for (i = 0; i < n && a[i] == 0; ++i);
	// нулевое слово?
	if (i == n)
		return n * B_PER_W;
	// ...ненулевое
	return i * B_PER_W + wordCTZ(a[i]);
}